

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recycle.c
# Opt level: O3

RUNE_DATA * new_rune(void)

{
  RUNE_DATA *pRVar1;
  
  if (rune_free == (RUNE_DATA *)0x0) {
    pRVar1 = (RUNE_DATA *)operator_new(0x50);
  }
  else {
    pRVar1 = rune_free;
    rune_free = rune_free->next;
  }
  pRVar1->next_content = (RUNE_DATA *)0x0;
  pRVar1->end_fun = (RUNE_END *)0x0;
  *(undefined8 *)&pRVar1->drawn_in = 0;
  pRVar1->next = (RUNE_DATA *)0x0;
  pRVar1->level = 0;
  pRVar1->duration = 0;
  pRVar1->type = 0;
  pRVar1->extra = 0;
  pRVar1->owner = (CHAR_DATA *)0x0;
  pRVar1->target_type = 0;
  pRVar1->trigger_type = 0;
  pRVar1->function = (RUNE_FUN *)0x0;
  pRVar1->placed_on = (void *)0x0;
  return pRVar1;
}

Assistant:

RUNE_DATA *new_rune(void)
{
	static RUNE_DATA rune_zero;
	RUNE_DATA *rune;

	if (rune_free == nullptr)
	{
		rune = new RUNE_DATA;
	}
	else
	{
		rune = rune_free;
		rune_free = rune->next;
	}

	*rune = rune_zero;
	return rune;
}